

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

void __thiscall
QMainWindowLayout::applyState(QMainWindowLayout *this,QMainWindowLayoutState *newState,bool animate)

{
  QDockAreaLayoutInfo *this_00;
  Span *pSVar1;
  QDockWidgetGroupWindow **ppQVar2;
  int iVar3;
  QWidget *pQVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long in_FS_OFFSET;
  QSet<QWidget_*> retiredSeps;
  QSet<QWidget_*> usedSeps;
  QSet<QTabBar_*> retired;
  QSet<QTabBar_*> used;
  QHash<QWidget_*,_QHashDummyValue> local_80;
  undefined1 local_78 [24];
  QHash<QTabBar_*,_QHashDummyValue> local_60;
  QArrayDataPointer<QDockWidgetGroupWindow_*> local_58;
  undefined1 local_40 [16];
  
  local_40._8_8_ = *(long *)(in_FS_OFFSET + 0x28);
  if (this[0x800] == (QMainWindowLayout)0x0) {
    this[0x800] = (QMainWindowLayout)0x1;
    local_40._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QDockAreaLayout::usedTabBars((QDockAreaLayout *)local_40);
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (QDockWidgetGroupWindow **)&DAT_aaaaaaaaaaaaaaaa;
    QObject::findChildren<QDockWidgetGroupWindow*>
              ((QList<QDockWidgetGroupWindow_*> *)&local_58,
               *(QObject **)(*(long *)(this + 8) + 0x10),(FindChildOptions)0x0);
    ppQVar2 = local_58.ptr;
    lVar7 = local_58.size << 3;
    this_00 = (QDockAreaLayoutInfo *)(local_78 + 8);
    for (lVar6 = 0; lVar7 != lVar6; lVar6 = lVar6 + 8) {
      QWidget::layout(*(QWidget **)(&((QWidget *)ppQVar2)->super_QObject + lVar6));
      QDockAreaLayoutInfo::usedTabBars(this_00);
      QSet<QTabBar_*>::unite((QSet<QTabBar_*> *)local_40,(QSet<QTabBar_*> *)this_00);
      QHash<QTabBar_*,_QHashDummyValue>::~QHash((QHash<QTabBar_*,_QHashDummyValue> *)this_00);
    }
    local_60.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    operator-((QSet<QTabBar_*> *)&local_60,(QSet<QTabBar_*> *)(this + 0x718));
    QHash<QTabBar_*,_QHashDummyValue>::operator=
              ((QHash<QTabBar_*,_QHashDummyValue> *)(this + 0x718),
               (QHash<QTabBar_*,_QHashDummyValue> *)local_40);
    local_78._8_16_ = (undefined1  [16])QHash<QTabBar_*,_QHashDummyValue>::begin(&local_60);
    while( true ) {
      if (local_78._8_8_ == (Data<QHashPrivate::Node<QTabBar_*,_QHashDummyValue>_> *)0x0 &&
          local_78._16_8_ == 0) break;
      pSVar1 = (local_78._8_8_)->spans;
      uVar5 = local_78._16_8_ >> 7;
      pQVar4 = *(QWidget **)
                pSVar1[uVar5].entries[pSVar1[uVar5].offsets[local_78._16_4_ & 0x7f]].storage.data;
      QWidget::hide(pQVar4);
      while( true ) {
        iVar3 = QTabBar::count((QTabBar *)pQVar4);
        if (iVar3 < 1) break;
        QTabBar::removeTab((QTabBar *)pQVar4,0);
      }
      QList<QTabBar_*>::append((QList<QTabBar_*> *)(this + 0x720),(parameter_type)pQVar4);
      QHashPrivate::iterator<QHashPrivate::Node<QTabBar_*,_QHashDummyValue>_>::operator++
                ((iterator<QHashPrivate::Node<QTabBar_*,_QHashDummyValue>_> *)(local_78 + 8));
    }
    if (*(int *)(this + 0x760) == 1) {
      local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QDockAreaLayout::usedSeparatorWidgets((QDockAreaLayout *)local_78);
      local_80.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      operator-((QSet<QWidget_*> *)&local_80,(QSet<QWidget_*> *)(this + 0x740));
      QHash<QWidget_*,_QHashDummyValue>::operator=
                ((QHash<QWidget_*,_QHashDummyValue> *)(this + 0x740),
                 (QHash<QWidget_*,_QHashDummyValue> *)local_78);
      local_78._8_16_ = (undefined1  [16])QHash<QWidget_*,_QHashDummyValue>::begin(&local_80);
      while( true ) {
        if (local_78._8_8_ == (Data<QHashPrivate::Node<QTabBar_*,_QHashDummyValue>_> *)0x0 &&
            local_78._16_8_ == 0) break;
        pSVar1 = (local_78._8_8_)->spans;
        uVar5 = local_78._16_8_ >> 7;
        pQVar4 = *(QWidget **)
                  pSVar1[uVar5].entries[pSVar1[uVar5].offsets[local_78._16_4_ & 0x7f]].storage.data;
        QList<QWidget_*>::append((QList<QWidget_*> *)(this + 0x748),pQVar4);
        QWidget::hide(pQVar4);
        QHashPrivate::iterator<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_>::operator++
                  ((iterator<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_> *)(local_78 + 8));
      }
      QHash<QWidget_*,_QHashDummyValue>::~QHash(&local_80);
      QHash<QWidget_*,_QHashDummyValue>::~QHash((QHash<QWidget_*,_QHashDummyValue> *)local_78);
    }
    for (lVar6 = 0x158; lVar6 != 0x318; lVar6 = lVar6 + 0x70) {
      pQVar4 = QLayout::parentWidget((QLayout *)this);
      QDockAreaLayoutInfo::reparentWidgets
                ((QDockAreaLayoutInfo *)((long)(newState->toolBarAreaLayout).docks + lVar6 + -0x30),
                 pQVar4);
    }
    QMainWindowLayoutState::apply(newState,(bool)(animate & (byte)this[0x700]));
    this[0x800] = (QMainWindowLayout)0x0;
    QHash<QTabBar_*,_QHashDummyValue>::~QHash(&local_60);
    QArrayDataPointer<QDockWidgetGroupWindow_*>::~QArrayDataPointer(&local_58);
    QHash<QTabBar_*,_QHashDummyValue>::~QHash((QHash<QTabBar_*,_QHashDummyValue> *)local_40);
  }
  if (*(int **)(in_FS_OFFSET + 0x28) == (int *)local_40._8_8_) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMainWindowLayout::applyState(QMainWindowLayoutState &newState, bool animate)
{
    // applying the state can lead to showing separator widgets, which would lead to a re-layout
    // (even though the separator widgets are not really part of the layout)
    // break the loop
    if (isInApplyState)
        return;
    isInApplyState = true;
#if QT_CONFIG(dockwidget) && QT_CONFIG(tabwidget)
    QSet<QTabBar*> used = newState.dockAreaLayout.usedTabBars();
    const auto groups =
            parent()->findChildren<QDockWidgetGroupWindow*>(Qt::FindDirectChildrenOnly);
    for (QDockWidgetGroupWindow *dwgw : groups)
        used += dwgw->layoutInfo()->usedTabBars();

    const QSet<QTabBar*> retired = usedTabBars - used;
    usedTabBars = used;
    for (QTabBar *tab_bar : retired) {
        tab_bar->hide();
        while (tab_bar->count() > 0)
            tab_bar->removeTab(0);
        unusedTabBars.append(tab_bar);
    }

    if (sep == 1) {
        const QSet<QWidget*> usedSeps = newState.dockAreaLayout.usedSeparatorWidgets();
        const QSet<QWidget*> retiredSeps = usedSeparatorWidgets - usedSeps;
        usedSeparatorWidgets = usedSeps;
        for (QWidget *sepWidget : retiredSeps) {
            unusedSeparatorWidgets.append(sepWidget);
            sepWidget->hide();
        }
    }

    for (int i = 0; i < QInternal::DockCount; ++i)
        newState.dockAreaLayout.docks[i].reparentWidgets(parentWidget());

#endif // QT_CONFIG(dockwidget) && QT_CONFIG(tabwidget)
    newState.apply(dockOptions & QMainWindow::AnimatedDocks && animate);
    isInApplyState = false;
}